

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  bool bVar1;
  long lVar2;
  Literal *other;
  long lVar3;
  Literal local_90;
  Literal local_78;
  long local_60;
  Literal *local_58;
  Literals *local_50;
  ulong *local_48;
  ulong local_40;
  char local_31;
  
  lVar2 = __tls_get_addr(&PTR_01079ea8);
  local_48 = (ulong *)(lVar2 + 0x818);
  local_40 = *local_48;
  *local_48 = local_40 + 1;
  if (local_40 + 1 < 100) {
    if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 1) {
      Literal::Literal(&local_78,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      operator<<(o,&local_78);
      Literal::~Literal(&local_78);
    }
    else {
      local_31 = '(';
      std::__ostream_insert<char,std::char_traits<char>>(o,&local_31,1);
      local_60 = ((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                 (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
      local_50 = literals;
      if (local_60 != 0) {
        local_58 = (literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
        bVar1 = true;
        lVar2 = -0x18;
        lVar3 = 0;
        do {
          other = (Literal *)
                  ((long)&((local_50->super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start)->field_0 + lVar2);
          if (lVar3 == 0) {
            other = local_58;
          }
          if (99 < *local_48) {
            std::__ostream_insert<char,std::char_traits<char>>(o,"[..]",4);
            break;
          }
          if (!bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
          }
          Literal::Literal(&local_90,other);
          operator<<(o,&local_90);
          Literal::~Literal(&local_90);
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + 0x18;
          bVar1 = false;
        } while (local_60 != lVar3);
      }
      local_31 = ')';
      o = std::__ostream_insert<char,std::char_traits<char>>(o,&local_31,1);
    }
    if (local_40 == 0) {
      *local_48 = 0;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(o,"[..]",4);
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  PrintLimiter limiter;

  if (limiter.stop()) {
    return o << "[..]";
  }

  if (literals.size() == 1) {
    return o << literals[0];
  }

  o << '(';
  bool first = true;
  for (auto& literal : literals) {
    if (limiter.stop()) {
      o << "[..]";
      break;
    }
    if (first) {
      first = false;
    } else {
      o << ", ";
    }
    o << literal;
  }
  return o << ')';
}